

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

RefNull * __thiscall MixedArena::alloc<wasm::RefNull>(MixedArena *this)

{
  RefNull *pRVar1;
  
  pRVar1 = (RefNull *)allocSpace(this,0x10,8);
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression._id = RefNullId;
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id = 0;
  return pRVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }